

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

bool __thiscall
robin_hood::detail::
Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
try_increase_info(Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                  *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->mInfoInc;
  if (2 < uVar1) {
    this->mInfoInc = uVar1 >> 1 & 0xff;
    this->mInfoHashShift = this->mInfoHashShift + 1;
    uVar3 = this->mMask + 1;
    if (uVar3 < 0x28f5c28f5c28f5d) {
      uVar4 = (uVar3 * 0x50) / 100;
    }
    else {
      uVar4 = (uVar3 / 100) * 0x50;
    }
    uVar2 = 0xff;
    if (uVar4 < 0xff) {
      uVar2 = uVar4;
    }
    uVar2 = uVar2 + uVar3;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        *(ulong *)(this->mInfo + uVar3) = *(ulong *)(this->mInfo + uVar3) >> 1 & 0x7f7f7f7f7f7f7f7f;
        uVar3 = uVar3 + 8;
      } while (uVar3 < uVar2);
    }
    this->mInfo[uVar2] = '\x01';
    uVar3 = this->mMask + 1;
    if (uVar3 < 0x28f5c28f5c28f5d) {
      uVar3 = (uVar3 * 0x50) / 100;
    }
    else {
      uVar3 = (uVar3 / 100) * 0x50;
    }
    this->mMaxNumElementsAllowed = uVar3;
  }
  return 2 < uVar1;
}

Assistant:

bool try_increase_info() {
        ROBIN_HOOD_LOG("mInfoInc=" << mInfoInc << ", numElements=" << mNumElements
                                   << ", maxNumElementsAllowed="
                                   << calcMaxNumElementsAllowed(mMask + 1))
        if (mInfoInc <= 2) {
            // need to be > 2 so that shift works (otherwise undefined behavior!)
            return false;
        }
        // we got space left, try to make info smaller
        mInfoInc = static_cast<uint8_t>(mInfoInc >> 1U);

        // remove one bit of the hash, leaving more space for the distance info.
        // This is extremely fast because we can operate on 8 bytes at once.
        ++mInfoHashShift;
        auto const numElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        for (size_t i = 0; i < numElementsWithBuffer; i += 8) {
            auto val = unaligned_load<uint64_t>(mInfo + i);
            val = (val >> 1U) & UINT64_C(0x7f7f7f7f7f7f7f7f);
            std::memcpy(mInfo + i, &val, sizeof(val));
        }
        // update sentinel, which might have been cleared out!
        mInfo[numElementsWithBuffer] = 1;

        mMaxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        return true;
    }